

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

bool tchecker::zg::shared_is_alu_le(state_t *s1,state_t *s2,map_t *l,map_t *u)

{
  long lVar1;
  bool bVar2;
  overflow_error *poVar3;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_30;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
  local_28;
  
  bVar2 = ta::shared_equal_to(&s1->super_state_t,&s2->super_state_t);
  if (bVar2) {
    local_28._t = (s1->_zone)._t;
    if ((&(local_28._t)->super_zone_t != (zone_t *)0x0) &&
       (lVar1 = *(long *)(&(local_28._t)->super_zone_t + -2),
       *(long *)(&(local_28._t)->super_zone_t + -2) = lVar1 + 1, lVar1 + 1 == -2)) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"reference counter overflow");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    local_30._t = (s2->_zone)._t;
    if ((&(local_30._t)->super_zone_t != (zone_t *)0x0) &&
       (lVar1 = *(long *)(&(local_30._t)->super_zone_t + -2),
       *(long *)(&(local_30._t)->super_zone_t + -2) = lVar1 + 1, lVar1 + 1 == -2)) {
      poVar3 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(poVar3,"reference counter overflow");
      __cxa_throw(poVar3,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    if (local_28._t == local_30._t) {
      bVar2 = true;
    }
    else {
      if ((&(local_28._t)->super_zone_t == (zone_t *)0x0) ||
         (&(local_30._t)->super_zone_t == (zone_t *)0x0)) {
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1d0,
                      "T &tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::zone_t>>::operator*() const [T = tchecker::make_shared_t<tchecker::zg::zone_t>]"
                     );
      }
      bVar2 = zone_t::is_alu_le(&(local_28._t)->super_zone_t,&(local_30._t)->super_zone_t,l,u);
    }
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_30);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::zone_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_28);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool shared_is_alu_le(tchecker::zg::state_t const & s1, tchecker::zg::state_t const & s2,
                      tchecker::clockbounds::map_t const & l, tchecker::clockbounds::map_t const & u)
{
  return tchecker::ta::shared_equal_to(s1, s2) && (s1.zone_ptr() == s2.zone_ptr() || s1.zone().is_alu_le(s2.zone(), l, u));
}